

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void discharge2reg(FuncState *fs,expdesc *e,int reg)

{
  Instruction *pIVar1;
  int iVar2;
  ravi_type_map rVar3;
  uint uVar4;
  TString *in_RAX;
  OpCode o;
  TString *usertype;
  
  usertype = in_RAX;
  luaK_dischargevars(fs,e);
  switch(e->k) {
  case VNIL:
    luaK_nil(fs,reg,1);
    break;
  case VTRUE:
  case VFALSE:
    uVar4 = (uint)(e->k == VTRUE);
    o = OP_LOADBOOL;
LAB_001429fc:
    luaK_codeABC(fs,o,reg,uVar4,0);
    break;
  case VK:
    iVar2 = (e->u).info;
    goto LAB_00142aec;
  case VKFLT:
    iVar2 = luaK_numberK(fs,(e->u).nval);
    goto LAB_00142aec;
  case VKINT:
    iVar2 = luaK_intK(fs,(e->u).ival);
LAB_00142aec:
    luaK_codek(fs,reg,iVar2);
    break;
  case VNONRELOC:
    if ((e->u).info != reg) {
      usertype = (TString *)0x0;
      rVar3 = raviY_get_register_typeinfo(fs,reg,&usertype);
      uVar4 = (e->u).info;
      if (rVar3 == 0x80) {
        o = OP_RAVI_MOVETAB;
      }
      else if (rVar3 == 0x10) {
        o = OP_RAVI_MOVEF;
      }
      else if (rVar3 == 0x20) {
        o = OP_RAVI_MOVEIARRAY;
      }
      else if (rVar3 == 0x40) {
        o = OP_RAVI_MOVEFARRAY;
      }
      else if (rVar3 == 8) {
        o = OP_RAVI_MOVEI;
      }
      else {
        luaK_codeABC(fs,OP_MOVE,reg,uVar4,0);
        if (rVar3 == 0x201) {
          o = OP_RAVI_TOCLOSURE;
        }
        else {
          if (rVar3 != 0x101) {
            if (usertype != (TString *)0x0 && rVar3 == 0x401) {
              uVar4 = luaK_stringK(fs,usertype);
              luaK_codeABx(fs,OP_RAVI_TOTYPE,reg,uVar4);
            }
            break;
          }
          o = OP_RAVI_TOSTRING;
        }
        uVar4 = 0;
      }
      goto LAB_001429fc;
    }
    break;
  default:
    __assert_fail("e->k == VJMP",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x2cb,"void discharge2reg(FuncState *, expdesc *, int)");
  case VJMP:
    goto switchD_001429ea_caseD_b;
  case VRELOCABLE:
    iVar2 = (e->u).info;
    pIVar1 = fs->f->code;
    *(byte *)((long)pIVar1 + (long)iVar2 * 4 + 1) = (byte)reg & 0x7f;
    if ((ravi_parser_debug & 1U) != 0) {
      raviY_printf(fs,"discharge2reg (VRELOCABLE set arg A) %e\n",e);
    }
    if ((ravi_parser_debug & 2U) != 0) {
      raviY_printf(fs,"[%d]* %o ; set A to %d\n",(ulong)(uint)(e->u).info,(ulong)pIVar1[iVar2],
                   (ulong)(uint)reg);
    }
  }
  (e->u).info = reg;
  e->k = VNONRELOC;
switchD_001429ea_caseD_b:
  return;
}

Assistant:

static void discharge2reg (FuncState *fs, expdesc *e, int reg) {
  luaK_dischargevars(fs, e);
  switch (e->k) {
    case VNIL: {
      luaK_nil(fs, reg, 1);
      break;
    }
    case VFALSE: case VTRUE: {
      luaK_codeABC(fs, OP_LOADBOOL, reg, e->k == VTRUE, 0);
      break;
    }
    case VK: {
      luaK_codek(fs, reg, e->u.info);
      break;
    }
    case VKFLT: {
      luaK_codek(fs, reg, luaK_numberK(fs, e->u.nval));
      break;
    }
    case VKINT: {
      luaK_codek(fs, reg, luaK_intK(fs, e->u.ival));
      break;
    }
    case VRELOCABLE: {
      Instruction *pc = &getinstruction(fs, e);
      SETARG_A(*pc, reg);  /* instruction will put result in 'reg' */
      DEBUG_EXPR(raviY_printf(fs, "discharge2reg (VRELOCABLE set arg A) %e\n", e));
      DEBUG_CODEGEN(raviY_printf(fs, "[%d]* %o ; set A to %d\n", e->u.info, *pc, reg));
      break;
    }
    case VNONRELOC: {
      if (reg != e->u.info) {
        /* code a MOVEI or MOVEF if the target register is a local typed variable */
        TString *usertype = NULL;
        int ravi_type = raviY_get_register_typeinfo(fs, reg, &usertype);
        switch (ravi_type) {
        case RAVI_TM_INTEGER:
          luaK_codeABC(fs, OP_RAVI_MOVEI, reg, e->u.info, 0);
          break;
        case RAVI_TM_FLOAT:
          luaK_codeABC(fs, OP_RAVI_MOVEF, reg, e->u.info, 0);
          break;
        case RAVI_TM_INTEGER_ARRAY:
          luaK_codeABC(fs, OP_RAVI_MOVEIARRAY, reg, e->u.info, 0);
          break;
        case RAVI_TM_FLOAT_ARRAY:
          luaK_codeABC(fs, OP_RAVI_MOVEFARRAY, reg, e->u.info, 0);
          break;
        case RAVI_TM_TABLE:
          luaK_codeABC(fs, OP_RAVI_MOVETAB, reg, e->u.info, 0);
          break;
        default:
          luaK_codeABC(fs, OP_MOVE, reg, e->u.info, 0);
          if (ravi_type == RAVI_TM_STRING_OR_NIL)
            luaK_codeABC(fs, OP_RAVI_TOSTRING, reg, 0, 0);
          else if (ravi_type == RAVI_TM_FUNCTION_OR_NIL)
            luaK_codeABC(fs, OP_RAVI_TOCLOSURE, reg, 0, 0);
          else if (ravi_type == RAVI_TM_USERDATA_OR_NIL && usertype)
            luaK_codeABx(fs, OP_RAVI_TOTYPE, reg, luaK_stringK(fs, usertype));
          break;
        }
      }
      break;
    }
    default: {
      lua_assert(e->k == VJMP);
      return;  /* nothing to do... */
    }
  }
  e->u.info = reg;
  e->k = VNONRELOC;
}